

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O2

void Acb_NtkPushLogic2(Acb_Ntk_t *p,int nLutSize,int fVerbose)

{
  Acb_ObjType_t AVar1;
  int iVar2;
  int iFanout;
  int k;
  int i;
  
  Acb_NtkCreateFanout(p);
  for (i = 1; i < (p->vObjType).nSize; i = i + 1) {
    AVar1 = Acb_ObjType(p,i);
    if (AVar1 != ABC_OPER_NONE) {
      iVar2 = Acb_ObjIsCio(p,i);
      if (iVar2 == 0) break;
    }
  }
  iVar2 = Acb_ObjFaninNum(p,i);
  iFanout = Acb_ObjFanout(p,i,k);
  Acb_ObjPushToFanout(p,i,iVar2 + -1,iFanout);
  return;
}

Assistant:

void Acb_NtkPushLogic2( Acb_Ntk_t * p, int nLutSize, int fVerbose )
{
    int iObj;
    Acb_NtkCreateFanout( p );  // fanout data structure
    Acb_NtkForEachObj( p, iObj )
        if ( !Acb_ObjIsCio(p, iObj) )
            break;
    Acb_ObjPushToFanout( p, iObj, Acb_ObjFaninNum(p, iObj)-1, Acb_ObjFanout(p, iObj, 0) );
//    Acb_ObjPushToFanin( p, Acb_ObjFanout(p, iObj, 0), Acb_ObjFaninNum(p, iObj)-1, iObj );
}